

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Switch * __thiscall
wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (Builder *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *list,Name default_,
          Expression *condition,Expression *value)

{
  Module *pMVar1;
  Switch *pSVar2;
  
  pMVar1 = this->wasm;
  pSVar2 = (Switch *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x158),0x50,8);
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id = SwitchId;
  (pSVar2->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pSVar2->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pSVar2->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (pSVar2->targets).allocator = (MixedArena *)(pMVar1 + 0x158);
  (pSVar2->default_).super_IString.str._M_len = 0;
  (pSVar2->default_).super_IString.str._M_str = (char *)0x0;
  pSVar2->value = (Expression *)0x0;
  pSVar2->condition = (Expression *)0x0;
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression.type.id = 1;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pSVar2->targets,list);
  (pSVar2->default_).super_IString.str._M_len = default_.super_IString.str._M_len;
  (pSVar2->default_).super_IString.str._M_str = default_.super_IString.str._M_str;
  pSVar2->value = value;
  pSVar2->condition = condition;
  return pSVar2;
}

Assistant:

Switch* makeSwitch(T& list,
                     Name default_,
                     Expression* condition,
                     Expression* value = nullptr) {
    auto* ret = wasm.allocator.alloc<Switch>();
    ret->targets.set(list);
    ret->default_ = default_;
    ret->value = value;
    ret->condition = condition;
    return ret;
  }